

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(KeyValue *a,KeyValue *b)

{
  _KeyValue__isset _Var1;
  
  std::__cxx11::string::swap((string *)&a->key);
  std::__cxx11::string::swap((string *)&a->value);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(KeyValue &a, KeyValue &b) {
  using ::std::swap;
  swap(a.key, b.key);
  swap(a.value, b.value);
  swap(a.__isset, b.__isset);
}